

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createSphereShapedHair
          (SceneGraph *this,Vec3fa *center,float radius,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  ulong uVar1;
  pointer *ppHVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  iterator __position;
  pointer pvVar5;
  size_t sVar6;
  Vec3fx *pVVar7;
  undefined8 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar9;
  Node *pNVar10;
  HairSetNode *this_00;
  Vec3fx *pVVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Ref<embree::SceneGraph::MaterialNode> local_90;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  Hair local_70;
  float local_68;
  Node *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_88 = center;
  local_68 = radius;
  this_00 = (HairSetNode *)operator_new(0x118);
  local_90 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_90.ptr != (MaterialNode *)0x0) {
    (*((local_90.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,&local_90,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_90.ptr != (MaterialNode *)0x0) {
    (*((local_90.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_70.vertex = 0;
  local_70.id = 0;
  __position._M_current =
       (this_00->hairs).
       super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (Node *)this;
  if (__position._M_current ==
      (this_00->hairs).
      super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair>(&this_00->hairs,__position,&local_70)
    ;
  }
  else {
    (__position._M_current)->vertex = 0;
    (__position._M_current)->id = 0;
    ppHVar2 = &(this_00->hairs).
               super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppHVar2 = *ppHVar2 + 1;
  }
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar16 = -local_68;
  fVar17 = (local_88->field_0).m128[0];
  fVar18 = (local_88->field_0).m128[1];
  fVar19 = (local_88->field_0).m128[2];
  sVar6 = pvVar5->size_active;
  uVar13 = pvVar5->size_alloced;
  uVar1 = sVar6 + 1;
  if (uVar13 < uVar1) {
    uVar15 = uVar1;
    uVar14 = uVar13;
    if (uVar13 != 0) {
      do {
        uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
        uVar14 = uVar15;
      } while (uVar15 < uVar1);
    }
    if (uVar13 != uVar15) {
      pVVar7 = pvVar5->items;
      pVVar11 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
      pvVar5->items = pVVar11;
      if (pvVar5->size_active != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          puVar3 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar12);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar13 < pvVar5->size_active);
      }
      alignedFree(pVVar7);
      pvVar5->size_active = sVar6;
      pvVar5->size_alloced = uVar15;
    }
  }
  pvVar5->size_active = uVar1;
  pVVar7 = pvVar5->items + sVar6;
  (pVVar7->field_0).m128[0] = fVar16 + fVar17;
  (pVVar7->field_0).m128[1] = fVar18 + 0.0;
  (pVVar7->field_0).m128[2] = fVar19 + 0.0;
  (pVVar7->field_0).m128[3] = local_68;
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar17 = (local_88->field_0).m128[0];
  fVar18 = (local_88->field_0).m128[1];
  fVar19 = (local_88->field_0).m128[2];
  sVar6 = pvVar5->size_active;
  uVar13 = pvVar5->size_alloced;
  uVar1 = sVar6 + 1;
  if (uVar13 < uVar1) {
    uVar15 = uVar1;
    uVar14 = uVar13;
    if (uVar13 != 0) {
      do {
        uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
        uVar14 = uVar15;
      } while (uVar15 < uVar1);
    }
    if (uVar13 != uVar15) {
      pVVar7 = pvVar5->items;
      pVVar11 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
      pvVar5->items = pVVar11;
      if (pvVar5->size_active != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          puVar3 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar12);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar13 < pvVar5->size_active);
      }
      alignedFree(pVVar7);
      pvVar5->size_active = sVar6;
      pvVar5->size_alloced = uVar15;
    }
  }
  fVar16 = local_68;
  pvVar5->size_active = uVar1;
  pVVar7 = pvVar5->items + sVar6;
  (pVVar7->field_0).m128[0] = fVar17 + 0.0;
  (pVVar7->field_0).m128[1] = fVar18 + 0.0;
  (pVVar7->field_0).m128[2] = fVar19 + 0.0;
  (pVVar7->field_0).m128[3] = local_68;
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  fVar17 = (local_88->field_0).m128[0] + 0.0;
  fVar18 = (local_88->field_0).m128[1] + 0.0;
  fVar19 = (local_88->field_0).m128[2] + 0.0;
  sVar6 = pvVar5->size_active;
  uVar13 = pvVar5->size_alloced;
  uVar1 = sVar6 + 1;
  if (uVar13 < uVar1) {
    uVar15 = uVar1;
    uVar14 = uVar13;
    if (uVar13 != 0) {
      do {
        uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
        uVar14 = uVar15;
      } while (uVar15 < uVar1);
    }
    if (uVar13 != uVar15) {
      pVVar7 = pvVar5->items;
      local_48 = fVar17;
      fStack_44 = fVar18;
      fStack_40 = fVar19;
      fStack_3c = (local_88->field_0).m128[3] + 0.0;
      pVVar11 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
      pvVar5->items = pVVar11;
      if (pvVar5->size_active != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          puVar3 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar12);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar13 < pvVar5->size_active);
      }
      alignedFree(pVVar7);
      pvVar5->size_active = sVar6;
      pvVar5->size_alloced = uVar15;
      fVar17 = local_48;
      fVar18 = fStack_44;
      fVar19 = fStack_40;
    }
  }
  pvVar5->size_active = uVar1;
  pVVar7 = pvVar5->items + sVar6;
  (pVVar7->field_0).m128[0] = fVar17;
  (pVVar7->field_0).m128[1] = fVar18;
  (pVVar7->field_0).m128[2] = fVar19;
  (pVVar7->field_0).m128[3] = fVar16;
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar9 = &local_88->field_0;
  fVar17 = local_68 + (local_88->field_0).m128[0];
  fVar18 = (local_88->field_0).m128[1] + 0.0;
  fVar19 = (local_88->field_0).m128[2] + 0.0;
  sVar6 = pvVar5->size_active;
  uVar13 = pvVar5->size_alloced;
  uVar1 = sVar6 + 1;
  if (uVar13 < uVar1) {
    uVar15 = uVar1;
    uVar14 = uVar13;
    if (uVar13 != 0) {
      do {
        uVar15 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
        uVar14 = uVar15;
      } while (uVar15 < uVar1);
    }
    if (uVar13 != uVar15) {
      local_88 = (Vec3fa *)CONCAT44(fVar18,fVar17);
      pVVar7 = pvVar5->items;
      fStack_80 = fVar19;
      fStack_7c = paVar9->m128[3] + 0.0;
      pVVar11 = (Vec3fx *)alignedMalloc(uVar15 << 4,0x10);
      pvVar5->items = pVVar11;
      if (pvVar5->size_active != 0) {
        lVar12 = 0;
        uVar13 = 0;
        do {
          puVar3 = (undefined8 *)((long)&pVVar7->field_0 + lVar12);
          uVar8 = puVar3[1];
          puVar4 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar12);
          *puVar4 = *puVar3;
          puVar4[1] = uVar8;
          uVar13 = uVar13 + 1;
          lVar12 = lVar12 + 0x10;
        } while (uVar13 < pvVar5->size_active);
      }
      alignedFree(pVVar7);
      pvVar5->size_active = sVar6;
      pvVar5->size_alloced = uVar15;
      fVar17 = (float)local_88;
      fVar18 = local_88._4_4_;
      fVar19 = fStack_80;
    }
  }
  pNVar10 = local_50;
  pvVar5->size_active = uVar1;
  pVVar7 = pvVar5->items + sVar6;
  (pVVar7->field_0).m128[0] = fVar17;
  (pVVar7->field_0).m128[1] = fVar18;
  (pVVar7->field_0).m128[2] = fVar19;
  (pVVar7->field_0).m128[3] = fVar16;
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)pNVar10;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createSphereShapedHair(const Vec3fa& center, const float radius, Ref<MaterialNode> material)
  {
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE,material,BBox1f(0,1),1);
    mesh->hairs.push_back(SceneGraph::HairSetNode::Hair(0,0));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(-radius,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(0,0,0),radius));
    mesh->positions[0].push_back(Vec3ff(center+Vec3fa(+radius,0,0),radius));
    return mesh.dynamicCast<SceneGraph::Node>();
  }